

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O2

void sCompRow_to_CompCol(int m,int n,int_t nnz,float *a,int_t *colind,int_t *rowptr,float **at,
                        int_t **rowind,int_t **colptr)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int_t *piVar4;
  float *pfVar5;
  int_t *piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  pfVar5 = floatMalloc((long)nnz);
  *at = pfVar5;
  piVar6 = intMalloc(nnz);
  *rowind = piVar6;
  piVar6 = intMalloc(n + 1);
  *colptr = piVar6;
  piVar6 = intCalloc(n);
  uVar7 = 0;
  uVar10 = (ulong)(uint)m;
  if (m < 1) {
    uVar10 = uVar7;
  }
  while (uVar7 != uVar10) {
    piVar1 = rowptr + uVar7;
    uVar7 = uVar7 + 1;
    for (lVar8 = (long)*piVar1; lVar8 < rowptr[uVar7]; lVar8 = lVar8 + 1) {
      piVar6[colind[lVar8]] = piVar6[colind[lVar8]] + 1;
    }
  }
  piVar4 = *colptr;
  *piVar4 = 0;
  uVar9 = 0;
  uVar7 = (ulong)(uint)n;
  if (n < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    piVar4[uVar9 + 1] = piVar6[uVar9] + piVar4[uVar9];
    piVar6[uVar9] = piVar4[uVar9];
  }
  uVar7 = 0;
  while (uVar9 = uVar7, uVar9 != uVar10) {
    for (lVar8 = (long)rowptr[uVar9]; uVar7 = uVar9 + 1, lVar8 < rowptr[uVar9 + 1];
        lVar8 = lVar8 + 1) {
      iVar2 = colind[lVar8];
      iVar3 = piVar6[iVar2];
      (*rowind)[iVar3] = (int_t)uVar9;
      (*at)[iVar3] = a[lVar8];
      piVar6[iVar2] = piVar6[iVar2] + 1;
    }
  }
  superlu_free(piVar6);
  return;
}

Assistant:

void
sCompRow_to_CompCol(int m, int n, int_t nnz, 
		    float *a, int_t *colind, int_t *rowptr,
		    float **at, int_t **rowind, int_t **colptr)
{
    register int i, j, col, relpos;
    int_t *marker;

    /* Allocate storage for another copy of the matrix. */
    *at = (float *) floatMalloc(nnz);
    *rowind = (int_t *) intMalloc(nnz);
    *colptr = (int_t *) intMalloc(n+1);
    marker = (int_t *) intCalloc(n);
    
    /* Get counts of each column of A, and set up column pointers */
    for (i = 0; i < m; ++i)
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) ++marker[colind[j]];
    (*colptr)[0] = 0;
    for (j = 0; j < n; ++j) {
	(*colptr)[j+1] = (*colptr)[j] + marker[j];
	marker[j] = (*colptr)[j];
    }

    /* Transfer the matrix into the compressed column storage. */
    for (i = 0; i < m; ++i) {
	for (j = rowptr[i]; j < rowptr[i+1]; ++j) {
	    col = colind[j];
	    relpos = marker[col];
	    (*rowind)[relpos] = i;
	    (*at)[relpos] = a[j];
	    ++marker[col];
	}
    }

    SUPERLU_FREE(marker);
}